

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerReinterpretFloat64(I64ToI32Lowering *this,Unary *curr)

{
  initializer_list<wasm::Expression_*> __l;
  IString str;
  initializer_list<wasm::Expression_*> __l_00;
  IString str_00;
  initializer_list<wasm::Expression_*> __l_01;
  IString str_01;
  Index index;
  pointer this_00;
  pointer pBVar1;
  Call *any;
  pointer pBVar2;
  pointer this_01;
  Call *pCVar3;
  LocalSet *append;
  Block *e;
  Module *pMVar4;
  IString specific;
  IString local_188;
  Type local_178;
  allocator<wasm::Expression_*> local_169;
  Const *local_168;
  Const **local_160;
  size_type local_158;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_150;
  size_t local_138;
  char *pcStack_130;
  string_view local_128;
  Type local_118;
  allocator<wasm::Expression_*> local_109;
  Const *local_108;
  Const **local_100;
  size_type local_f8;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_f0;
  size_t local_d8;
  char *pcStack_d0;
  string_view local_c8;
  Type local_b8;
  allocator<wasm::Expression_*> local_a9;
  Expression *local_a8;
  iterator local_a0;
  size_type local_98;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_90;
  size_t local_68;
  char *pcStack_60;
  string_view local_58;
  Block *local_48;
  Block *result;
  undefined1 local_38 [8];
  TempVar highBits;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)curr;
  wasm::Type::Type((Type *)&result,i32);
  getTemp((TempVar *)local_38,this,(Type)result);
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_68 = ABI::wasm2js::SCRATCH_STORE_F64;
  pcStack_60 = DAT_03192de8;
  str_01.str._M_str = DAT_03192de8;
  str_01.str._M_len = ABI::wasm2js::SCRATCH_STORE_F64;
  wasm::Name::Name((Name *)&local_58,str_01);
  local_a8 = *(Expression **)(highBits.ty.id + 0x18);
  local_a0 = &local_a8;
  local_98 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_a9);
  __l_01._M_len = local_98;
  __l_01._M_array = local_a0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_90,__l_01,&local_a9);
  wasm::Type::Type(&local_b8,none);
  any = Builder::makeCall(pBVar1,(Name)local_58,&local_90,local_b8,false);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_38);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_d8 = ABI::wasm2js::SCRATCH_LOAD_I32;
  pcStack_d0 = DAT_03192d98;
  str_00.str._M_str = DAT_03192d98;
  str_00.str._M_len = ABI::wasm2js::SCRATCH_LOAD_I32;
  wasm::Name::Name((Name *)&local_c8,str_00);
  this_01 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  local_108 = Builder::makeConst<int>(this_01,1);
  local_100 = &local_108;
  local_f8 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_109);
  __l_00._M_len = local_f8;
  __l_00._M_array = (iterator)local_100;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_f0,__l_00,&local_109);
  wasm::Type::Type(&local_118,i32);
  pCVar3 = Builder::makeCall(pBVar2,(Name)local_c8,&local_f0,local_118,false);
  append = Builder::makeLocalSet(pBVar1,index,(Expression *)pCVar3);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_138 = ABI::wasm2js::SCRATCH_LOAD_I32;
  pcStack_130 = DAT_03192d98;
  str.str._M_str = DAT_03192d98;
  str.str._M_len = ABI::wasm2js::SCRATCH_LOAD_I32;
  wasm::Name::Name((Name *)&local_128,str);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  local_168 = Builder::makeConst<int>(pBVar2,0);
  local_160 = &local_168;
  local_158 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_169);
  __l._M_len = local_158;
  __l._M_array = (iterator)local_160;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_150,__l,&local_169);
  wasm::Type::Type(&local_178,i32);
  pCVar3 = Builder::makeCall(pBVar1,(Name)local_128,&local_150,local_178,false);
  e = Builder::blockify<wasm::Call*>(this_00,(Expression *)any,(Expression *)append,pCVar3);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_150);
  std::allocator<wasm::Expression_*>::~allocator(&local_169);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_f0);
  std::allocator<wasm::Expression_*>::~allocator(&local_109);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_90);
  std::allocator<wasm::Expression_*>::~allocator(&local_a9);
  local_48 = e;
  setOutParam(this,(Expression *)e,(TempVar *)local_38);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)local_48);
  pMVar4 = Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                       ).
                       super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                       .
                       super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                     );
  MemoryUtils::ensureExists(pMVar4);
  pMVar4 = Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                       ).
                       super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                       .
                       super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                     );
  local_188.str._M_len = 0;
  local_188.str._M_str = (char *)0x0;
  IString::IString(&local_188);
  specific.str._M_str = (char *)pCVar3;
  specific.str._M_len = (size_t)local_188.str._M_str;
  ABI::wasm2js::ensureHelpers((wasm2js *)pMVar4,(Module *)local_188.str._M_len,specific);
  TempVar::~TempVar((TempVar *)local_38);
  return;
}

Assistant:

void lowerReinterpretFloat64(Unary* curr) {
    // Assume that the wasm file assumes the address 0 is invalid and roundtrip
    // our f64 through memory at address 0
    TempVar highBits = getTemp();
    Block* result = builder->blockify(
      builder->makeCall(
        ABI::wasm2js::SCRATCH_STORE_F64, {curr->value}, Type::none),
      builder->makeLocalSet(highBits,
                            builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_I32,
                                              {builder->makeConst(int32_t(1))},
                                              Type::i32)),
      builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_I32,
                        {builder->makeConst(int32_t(0))},
                        Type::i32));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
    MemoryUtils::ensureExists(getModule());
    ABI::wasm2js::ensureHelpers(getModule());
  }